

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeffects.cpp
# Opt level: O2

void __thiscall QAlphaWidget::run(QAlphaWidget *this,int time)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  QSize QVar4;
  QSize QVar5;
  long lVar6;
  long in_FS_OFFSET;
  Object local_80 [8];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [32];
  code *local_48;
  undefined8 local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = 0x96;
  if (-1 < time) {
    iVar3 = time;
  }
  this->duration = iVar3;
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&this->widget);
  if (bVar1) {
    this->elapsed = 0;
    QElapsedTimer::start();
    this->showWidget = true;
    QWidget::setAttribute((QWidget *)(this->widget).wp.value,WA_WState_ExplicitShowHide,true);
    QWidget::setAttribute((QWidget *)(this->widget).wp.value,WA_WState_Hidden,false);
    QObject::installEventFilter(QCoreApplication::self);
    lVar6 = *(long *)((this->widget).wp.value + 0x20);
    QWidget::move(&this->super_QWidget,*(int *)(lVar6 + 0x14),*(int *)(lVar6 + 0x18));
    QVar4 = QWidget::size((QWidget *)(this->widget).wp.value);
    QVar5 = QWidget::size((QWidget *)(this->widget).wp.value);
    QWidget::resize(&this->super_QWidget,QVar4.wd.m_i.m_i,QVar5.ht.m_i.m_i);
    local_78 = 0;
    uStack_70 = 0xfffffffefffffffe;
    QWidget::grab((QWidget *)local_68,(QRect *)(this->widget).wp.value);
    QPixmap::toImage();
    QImage::operator=(&this->frontImage,(QImage *)&local_48);
    QImage::~QImage((QImage *)&local_48);
    QPixmap::~QPixmap((QPixmap *)local_68);
    iVar3 = QGuiApplication::primaryScreen();
    lVar6 = *(long *)((this->widget).wp.value + 0x20);
    QScreen::grabWindow((ulonglong)local_68,iVar3,0,*(int *)(lVar6 + 0x14),*(int *)(lVar6 + 0x18));
    QPixmap::toImage();
    QImage::operator=(&this->backImage,(QImage *)&local_48);
    QImage::~QImage((QImage *)&local_48);
    QPixmap::~QPixmap((QPixmap *)local_68);
    cVar2 = QImage::isNull();
    if (cVar2 == '\0') {
      lVar6 = QElapsedTimer::elapsed();
      if (lVar6 < this->duration / 2) {
        local_68._0_8_ = 0;
        local_68._8_8_ = 0xffffffffffffffff;
        QImage::copy((QRect *)&local_48);
        QImage::operator=(&this->mixedImage,(QImage *)&local_48);
        QImage::~QImage((QImage *)&local_48);
        QPixmap::fromImage((QPixmap *)&local_48,&this->mixedImage,0);
        QPixmap::operator=(&this->pm,(QPixmap *)&local_48);
        QPixmap::~QPixmap((QPixmap *)&local_48);
        QWidget::show(&this->super_QWidget);
        QWidget::setEnabled(&this->super_QWidget,false);
        local_48 = render;
        local_40._0_4_ = 0;
        local_40._4_4_ = 0;
        QObject::connect<void(QTimer::*)(QTimer::QPrivateSignal),void(QAlphaWidget::*)()>
                  (local_80,(offset_in_QTimer_to_subr)&this->anim,(ContextType *)QTimer::timeout,
                   (offset_in_QAlphaWidget_to_subr *)0x0,(ConnectionType)this);
        QMetaObject::Connection::~Connection((Connection *)local_80);
        QTimer::start((int)&this->anim);
        goto LAB_003d9b3e;
      }
    }
    this->duration = 0;
    render(this);
  }
LAB_003d9b3e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAlphaWidget::run(int time)
{
    duration = time;

    if (duration < 0)
        duration = 150;

    if (!widget)
        return;

    elapsed = 0;
    checkTime.start();

    showWidget = true;
#if defined(Q_OS_WIN)
    qApp->installEventFilter(this);
    widget->setWindowOpacity(0.0);
    widget->show();
    connect(&anim, &QTimer::timeout, this, &QAlphaWidget::render);
    anim.start(1);
#else
    //This is roughly equivalent to calling setVisible(true) without actually showing the widget
    widget->setAttribute(Qt::WA_WState_ExplicitShowHide, true);
    widget->setAttribute(Qt::WA_WState_Hidden, false);

    qApp->installEventFilter(this);

    move(widget->geometry().x(),widget->geometry().y());
    resize(widget->size().width(), widget->size().height());

    frontImage = widget->grab().toImage();
    backImage = QGuiApplication::primaryScreen()->grabWindow(0,
                                widget->geometry().x(), widget->geometry().y(),
                                widget->geometry().width(), widget->geometry().height()).toImage();

    if (!backImage.isNull() && checkTime.elapsed() < duration / 2) {
        mixedImage = backImage.copy();
        pm = QPixmap::fromImage(mixedImage);
        show();
        setEnabled(false);

        connect(&anim, &QTimer::timeout, this, &QAlphaWidget::render);
        anim.start(1);
    } else {
       duration = 0;
       render();
    }
#endif
}